

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O0

int lejp_parse(lejp_ctx *ctx,uchar *json,int len)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  byte *pbVar4;
  char cVar5;
  uint8_t uVar6;
  int iVar7;
  byte *pbVar8;
  byte local_28;
  byte local_26;
  byte local_25;
  int local_24;
  uchar ret;
  uchar s;
  uchar n;
  uchar c;
  int len_local;
  uchar *json_local;
  lejp_ctx *ctx_local;
  
  local_28 = 0xea;
  iVar3 = len;
  pbVar4 = json;
  if ((ctx->sp == '\0') && (iVar3 = len, pbVar4 = json, ctx->pst[ctx->pst_sp].ppos == '\0')) {
    (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x02');
    iVar3 = len;
    pbVar4 = json;
  }
LAB_00158c6f:
  do {
    while( true ) {
      _ret = pbVar4;
      local_24 = iVar3;
      iVar7 = local_24 + -1;
      if (local_24 == 0) {
        return -1;
      }
      pbVar8 = _ret + 1;
      local_25 = *_ret;
      bVar1 = ctx->st[ctx->sp].s;
      iVar3 = iVar7;
      pbVar4 = pbVar8;
      if ((((local_25 != 0x20) && (local_25 != 9)) && (local_25 != 10)) &&
         ((local_25 != 0xd && (local_25 != 0x23)))) break;
      if (local_25 == 10) {
        ctx->line = ctx->line + 1;
        ctx->st[ctx->sp].s = ctx->st[ctx->sp].s & 0xdf;
      }
      if ((bVar1 & 0x40) != 0) break;
      if (local_25 == 0x23) {
        ctx->st[ctx->sp].s = ctx->st[ctx->sp].s | 0x20;
      }
    }
  } while ((ctx->st[ctx->sp].s & 0x20U) != 0);
  switch(bVar1) {
  case 0:
    if (local_25 != 0x7b) {
      local_28 = 0xfe;
      goto LAB_0015a3a1;
    }
    cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
    if (cVar5 != '\0') {
      local_28 = 0xe9;
      goto LAB_0015a3a1;
    }
    ctx->st[ctx->sp].s = '\x01';
    break;
  case 1:
    if (local_25 == 0x7d) {
      ctx->st[ctx->sp].s = '\0';
      local_28 = 0xfd;
      goto LAB_0015a3a1;
    }
    ctx->st[ctx->sp].s = '\x02';
    iVar3 = local_24;
    pbVar4 = _ret;
    goto LAB_00158c6f;
  case 2:
    if (local_25 != 0x22) {
      local_28 = 0xfc;
      goto LAB_0015a3a1;
    }
    ctx->st[ctx->sp].s = '\t';
    local_25 = 'C';
    goto LAB_0015a1cf;
  case 9:
    if (local_25 != 0x3a) {
      local_28 = 0xf7;
      goto LAB_0015a3a1;
    }
    ctx->st[ctx->sp].s = '\n';
    ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
    lejp_check_path_match(ctx);
    cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x05');
    if (cVar5 != '\0') {
      local_28 = 0xe9;
      goto LAB_0015a3a1;
    }
    break;
  case 10:
    if ((0x2f < local_25) && (local_25 < 0x3a)) {
      ctx->npos = '\0';
      ctx->dcount = '\0';
      ctx->f = '\0';
      ctx->st[ctx->sp].s = 'K';
      iVar3 = local_24;
      pbVar4 = _ret;
      goto LAB_00158c6f;
    }
    if (local_25 == 0x22) {
      ctx->st[ctx->sp].s = '\x0e';
      local_25 = 'C';
      ctx->npos = '\0';
      ctx->buf[0] = '\0';
      cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\v');
      if (cVar5 != '\0') {
        local_28 = 0xe9;
        goto LAB_0015a3a1;
      }
    }
    else {
      if (local_25 != 0x5b) {
        if (local_25 == 0x5d) {
          if (ctx->sp == '\0') {
            local_28 = 0xf1;
            goto LAB_0015a3a1;
          }
          ctx->sp = ctx->sp + 0xff;
          if (ctx->st[ctx->sp].s != '\x0f') {
            local_28 = 0xf0;
            goto LAB_0015a3a1;
          }
          if (ctx->sp != '\0') {
            ctx->pst[ctx->pst_sp].ppos = ctx->st[(int)(ctx->sp - 1)].p;
            ctx->ipos = ctx->st[(int)(ctx->sp - 1)].i;
          }
          ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
          if ((ctx->path_match != '\0') && (ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)) {
            ctx->path_match = '\0';
          }
          goto LAB_00159f8f;
        }
        if (local_25 == 0x66) {
          ctx->uni = 4;
          ctx->st[ctx->sp].s = 'M';
        }
        else if (local_25 == 0x6e) {
          ctx->uni = 9;
          ctx->st[ctx->sp].s = 'M';
        }
        else {
          if (local_25 != 0x74) {
            if (local_25 != 0x7b) {
              local_28 = 0xf6;
              goto LAB_0015a3a1;
            }
            ctx->st[ctx->sp].s = '\x0e';
            local_25 = '\x01';
            lejp_check_path_match(ctx);
            cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x10');
            if (cVar5 != '\0') {
              local_28 = 0xe9;
              goto LAB_0015a3a1;
            }
            ctx->path_match = '\0';
            goto LAB_0015a1cf;
          }
          ctx->uni = 0;
          ctx->st[ctx->sp].s = 'M';
        }
        break;
      }
      ctx->st[ctx->sp].s = '\x0f';
      local_25 = '\n';
      bVar1 = ctx->pst[ctx->pst_sp].ppos;
      ctx->pst[ctx->pst_sp].ppos = bVar1 + 1;
      ctx->path[bVar1] = '[';
      bVar1 = ctx->pst[ctx->pst_sp].ppos;
      ctx->pst[ctx->pst_sp].ppos = bVar1 + 1;
      ctx->path[bVar1] = ']';
      ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
      cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x0e');
      if (cVar5 != '\0') {
        local_28 = 0xe9;
        goto LAB_0015a3a1;
      }
      bVar1 = ctx->ipos;
      ctx->ipos = bVar1 + 1;
      ctx->i[bVar1] = 0;
      if (5 < ctx->ipos) {
        local_28 = 0xed;
        goto LAB_0015a3a1;
      }
    }
LAB_0015a1cf:
    if (((ctx->pst[ctx->pst_sp].ppos != '\0') && (ctx->st[ctx->sp].s != '\x0e')) &&
       (ctx->st[ctx->sp].s != '\x0f')) {
      bVar1 = ctx->pst[ctx->pst_sp].ppos;
      ctx->pst[ctx->pst_sp].ppos = bVar1 + 1;
      ctx->path[bVar1] = '.';
    }
    ctx->st[ctx->sp].p = ctx->pst[ctx->pst_sp].ppos;
    ctx->st[ctx->sp].i = ctx->ipos;
    uVar6 = ctx->sp + '\x01';
    ctx->sp = uVar6;
    if (uVar6 != '\f') {
      ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
      ctx->st[ctx->sp].s = local_25;
      ctx->st[ctx->sp].b = '\0';
      goto LAB_00158c6f;
    }
    local_28 = 0xee;
LAB_0015a3a1:
    (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x04');
    return (uint)local_28;
  case 0xe:
    ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
    if (local_25 == 0x2c) {
      ctx->st[ctx->sp].s = '\x02';
      if (ctx->sp == '\0') {
        ctx->pst[ctx->pst_sp].ppos = '\0';
        ctx->path_match = '\0';
      }
      else {
        ctx->pst[ctx->pst_sp].ppos = ctx->st[(int)(ctx->sp - 1)].p;
        ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
        if ((ctx->path_match != '\0') && (ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)) {
          ctx->path_match = '\0';
        }
        if (ctx->st[(int)(ctx->sp - 1)].s == '\x0f') {
          if (ctx->ipos != '\0') {
            iVar7 = ctx->ipos - 1;
            ctx->i[iVar7] = ctx->i[iVar7] + 1;
          }
          ctx->st[ctx->sp].s = '\n';
        }
      }
    }
    else {
      if (local_25 == 0x5d) {
        if (ctx->sp == '\0') {
          local_28 = 0xf1;
          goto LAB_0015a3a1;
        }
        ctx->sp = ctx->sp + 0xff;
        if (ctx->st[ctx->sp].s == '\x0f') {
          if (ctx->sp != '\0') {
            ctx->pst[ctx->pst_sp].ppos = ctx->st[(int)(ctx->sp - 1)].p;
            ctx->ipos = ctx->st[(int)(ctx->sp - 1)].i;
          }
          ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
          iVar3 = local_24;
          pbVar4 = _ret;
          if ((ctx->path_match != '\0') && (ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)) {
            ctx->path_match = '\0';
          }
          goto LAB_00158c6f;
        }
        local_28 = 0xf0;
        goto LAB_0015a3a1;
      }
      if (local_25 != 0x7d) {
        local_28 = 0xeb;
        goto LAB_0015a3a1;
      }
      if (ctx->sp == '\0') {
        lejp_check_path_match(ctx);
        cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
        if (cVar5 == '\0') {
          cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x03');
          if (cVar5 == '\0') {
            return iVar7;
          }
        }
        else {
          local_28 = 0xe9;
        }
        goto LAB_0015a3a1;
      }
      ctx->sp = ctx->sp + 0xff;
      if (ctx->sp != '\0') {
        ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp].p;
        ctx->ipos = ctx->st[ctx->sp].i;
      }
      ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
      if ((ctx->path_match != '\0') && (ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)) {
        ctx->path_match = '\0';
      }
      lejp_check_path_match(ctx);
      cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x11');
      if (cVar5 != '\0') {
        local_28 = 0xe9;
        goto LAB_0015a3a1;
      }
    }
    break;
  case 0xf:
LAB_00159f8f:
    ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
    if (local_25 == 0x2c) {
      if (ctx->ipos != '\0') {
        iVar7 = ctx->ipos - 1;
        ctx->i[iVar7] = ctx->i[iVar7] + 1;
      }
      ctx->st[ctx->sp].s = '\n';
      if (ctx->sp != '\0') {
        ctx->pst[ctx->pst_sp].ppos = ctx->st[(int)(ctx->sp - 1)].p;
      }
      ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
    }
    else {
      if (local_25 != 0x5d) {
        local_28 = 0xef;
        goto LAB_0015a3a1;
      }
      ctx->st[ctx->sp].s = '\x0e';
      (*ctx->pst[ctx->pst_sp].callback)(ctx,'\x0f');
    }
    break;
  case 0x43:
    if (local_25 == 0x22) {
      if (ctx->sp == '\0') {
        local_28 = 0xfb;
        goto LAB_0015a3a1;
      }
      if (ctx->st[(int)(ctx->sp - 1)].s != '\t') {
        ctx->buf[ctx->npos] = '\0';
        cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'M');
        if (cVar5 < '\0') {
          local_28 = 0xe9;
          goto LAB_0015a3a1;
        }
      }
      ctx->sp = ctx->sp + 0xff;
    }
    else {
      if (local_25 != 0x5c) {
        if (local_25 < 0x20) {
          local_28 = 0xfa;
          goto LAB_0015a3a1;
        }
        goto LAB_0015a0dc;
      }
      ctx->st[ctx->sp].s = 'D';
    }
    break;
  case 0x44:
    if (local_25 != 0x75) {
      local_26 = 0;
      while( true ) {
        if (8 < local_26) {
          local_28 = 0xf9;
          goto LAB_0015a3a1;
        }
        if ((uint)local_25 == (int)"\"\\/bfnrt"[local_26]) break;
        local_26 = local_26 + 1;
      }
      local_25 = "\"\\/\b\f\n\r\t"[local_26];
      ctx->st[ctx->sp].s = 'C';
      goto LAB_0015a0dc;
    }
    ctx->st[ctx->sp].s = 'E';
    ctx->uni = 0;
    break;
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
    ctx->uni = ctx->uni << 4;
    if ((local_25 < 0x30) || (0x39 < local_25)) {
      if ((local_25 < 0x61) || (0x66 < local_25)) {
        if ((local_25 < 0x41) || (0x46 < local_25)) {
          local_28 = 0xf8;
          goto LAB_0015a3a1;
        }
        ctx->uni = local_25 - 0x37;
      }
      else {
        ctx->uni = local_25 - 0x57;
      }
    }
    else {
      ctx->uni = ctx->uni | local_25 - 0x30;
    }
    ctx->st[ctx->sp].s = ctx->st[ctx->sp].s + '\x01';
    if (bVar1 == 0x46) {
      if (ctx->uni < 8) break;
      local_25 = (byte)((int)(uint)ctx->uni >> 4) & 0xf | 0xe0;
    }
    else if (bVar1 == 0x47) {
      if (ctx->uni < 0x80) {
        if (ctx->uni < 8) break;
        local_25 = (byte)((int)(uint)ctx->uni >> 2) | 0xc0;
      }
      else {
        local_25 = (byte)((int)(uint)ctx->uni >> 2) & 0x3f | 0x80;
      }
    }
    else {
      if (bVar1 != 0x48) break;
      if (ctx->uni < 0x80) {
        local_25 = (byte)ctx->uni;
      }
      else {
        local_25 = (byte)ctx->uni & 0x3f | 0x80;
      }
      ctx->st[ctx->sp].s = 'C';
    }
LAB_0015a0dc:
    if ((ctx->sp == '\0') || (ctx->st[(int)(ctx->sp - 1)].s != '\t')) {
      bVar1 = ctx->npos;
      ctx->npos = bVar1 + 1;
      ctx->buf[bVar1] = local_25;
      if (ctx->npos == 0xfe) {
        cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'L');
        if (cVar5 != '\0') {
          local_28 = 0xe9;
          goto LAB_0015a3a1;
        }
        ctx->npos = '\0';
      }
    }
    else {
      bVar1 = ctx->pst[ctx->pst_sp].ppos;
      ctx->pst[ctx->pst_sp].ppos = bVar1 + 1;
      ctx->path[bVar1] = local_25;
    }
    goto LAB_00158c6f;
  case 0x4b:
    if ((ctx->npos == '\0') && (local_25 == 0x2d)) {
      ctx->f = ctx->f | 1;
      goto LAB_0015a337;
    }
    if ((ctx->dcount < 0x14) && ((0x2f < local_25 && (local_25 < 0x3a)))) {
      if ((ctx->f & 2) != 0) {
        ctx->f = ctx->f | 4;
      }
      ctx->dcount = ctx->dcount + '\x01';
    }
    else if (local_25 == 0x2e) {
      if ((ctx->dcount == '\0') || ((ctx->f & 2) != 0)) {
        local_28 = 0xf4;
        goto LAB_0015a3a1;
      }
      ctx->f = ctx->f | 2;
    }
    else {
      if ((ctx->f & 6) == 2) {
        local_28 = 0xf5;
        goto LAB_0015a3a1;
      }
      if ((local_25 != 0x65) && (local_25 != 0x45)) {
        if (ctx->dcount == '\0') {
          local_28 = 0xf4;
          goto LAB_0015a3a1;
        }
        ctx->buf[ctx->npos] = '\0';
        if ((ctx->f & 2) == 0) {
          cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'I');
          if (cVar5 != '\0') {
            local_28 = 0xe9;
            goto LAB_0015a3a1;
          }
        }
        else {
          cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'J');
          if (cVar5 != '\0') {
            local_28 = 0xe9;
            goto LAB_0015a3a1;
          }
        }
        ctx->st[ctx->sp].s = '\x0e';
        iVar3 = local_24;
        pbVar4 = _ret;
        goto LAB_00158c6f;
      }
      if ((ctx->f & 8) != 0) {
        local_28 = 0xf4;
        goto LAB_0015a3a1;
      }
      ctx->f = ctx->f | 8;
      ctx->st[ctx->sp].s = 'L';
    }
    goto LAB_0015a337;
  case 0x4c:
    ctx->st[ctx->sp].s = 'K';
    if ((0x2f < local_25) && (iVar3 = local_24, pbVar4 = _ret, local_25 < 0x3a)) goto LAB_00158c6f;
    if ((local_25 != 0x2b) && (local_25 != 0x2d)) {
      local_28 = 0xf3;
      goto LAB_0015a3a1;
    }
LAB_0015a337:
    if (ctx->npos == 0xff) {
      local_28 = 0xec;
      goto LAB_0015a3a1;
    }
    bVar1 = ctx->npos;
    ctx->npos = bVar1 + 1;
    ctx->buf[bVar1] = local_25;
    iVar3 = iVar7;
    pbVar4 = pbVar8;
    goto LAB_00158c6f;
  case 0x4d:
    if ((uint)local_25 != (int)"rue alse ull "[ctx->uni]) {
      local_28 = 0xf2;
      goto LAB_0015a3a1;
    }
    ctx->uni = ctx->uni + 1;
    if ("rue alse ull "[ctx->uni] == ' ') {
      uVar2 = ctx->uni;
      if (uVar2 == 3) {
        ctx->buf[0] = '1';
        ctx->buf[1] = '\0';
        cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'F');
        if (cVar5 != '\0') {
          local_28 = 0xe9;
          goto LAB_0015a3a1;
        }
      }
      else if (uVar2 == 8) {
        ctx->buf[0] = '0';
        ctx->buf[1] = '\0';
        cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'G');
        if (cVar5 != '\0') {
          local_28 = 0xe9;
          goto LAB_0015a3a1;
        }
      }
      else if (uVar2 == 0xc) {
        ctx->buf[0] = '\0';
        cVar5 = (*ctx->pst[ctx->pst_sp].callback)(ctx,'H');
        if (cVar5 != '\0') {
          local_28 = 0xe9;
          goto LAB_0015a3a1;
        }
      }
      ctx->st[ctx->sp].s = '\x0e';
    }
  }
  goto LAB_00158c6f;
}

Assistant:

int
lejp_parse(struct lejp_ctx *ctx, const unsigned char *json, int len)
{
	unsigned char c, n, s, ret = LEJP_REJECT_UNKNOWN;
	static const char esc_char[] = "\"\\/bfnrt";
	static const char esc_tran[] = "\"\\/\b\f\n\r\t";
	static const char tokens[] = "rue alse ull ";

	if (!ctx->sp && !ctx->pst[ctx->pst_sp].ppos)
		ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_START);

	while (len--) {
		c = *json++;
		s = ctx->st[ctx->sp].s;

		/* skip whitespace unless we should care */
		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' || c == '#') {
			if (c == '\n') {
				ctx->line++;
				ctx->st[ctx->sp].s &= ~LEJP_FLAG_WS_COMMENTLINE;
			}
			if (!(s & LEJP_FLAG_WS_KEEP)) {
				if (c == '#')
					ctx->st[ctx->sp].s |=
						LEJP_FLAG_WS_COMMENTLINE;
				continue;
			}
		}

		if (ctx->st[ctx->sp].s & LEJP_FLAG_WS_COMMENTLINE)
			continue;

		switch (s) {
		case LEJP_IDLE:
			if (c != '{') {
				ret = LEJP_REJECT_IDLE_NO_BRACE;
				goto reject;
			}
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MEMBERS;
			break;
		case LEJP_MEMBERS:
			if (c == '}') {
				ctx->st[ctx->sp].s = LEJP_IDLE;
				ret = LEJP_REJECT_MEMBERS_NO_CLOSE;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_M_P;
			goto redo_character;
		case LEJP_M_P:
			if (c != '\"') {
				ret = LEJP_REJECT_MP_NO_OPEN_QUOTE;
				goto reject;
			}
			/* push */
			ctx->st[ctx->sp].s = LEJP_MP_DELIM;
			c = LEJP_MP_STRING;
			goto add_stack_level;

		case LEJP_MP_STRING:
			if (c == '\"') {
				if (!ctx->sp) { /* JSON can't end on quote */
					ret = LEJP_REJECT_MP_STRING_UNDERRUN;
					goto reject;
				}
				if (ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
					ctx->buf[ctx->npos] = '\0';
					if (ctx->pst[ctx->pst_sp].callback(ctx,
						      LEJPCB_VAL_STR_END) < 0) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
				}
				/* pop */
				ctx->sp--;
				break;
			}
			if (c == '\\') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC;
				break;
			}
			if (c < ' ') {/* "control characters" not allowed */
				ret = LEJP_REJECT_MP_ILLEGAL_CTRL;
				goto reject;
			}
			goto emit_string_char;

		case LEJP_MP_STRING_ESC:
			if (c == 'u') {
				ctx->st[ctx->sp].s = LEJP_MP_STRING_ESC_U1;
				ctx->uni = 0;
				break;
			}
			for (n = 0; n < sizeof(esc_char); n++) {
				if (c != esc_char[n])
					continue;
				/* found it */
				c = esc_tran[n];
				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			}
			ret = LEJP_REJECT_MP_STRING_ESC_ILLEGAL_ESC;
			/* illegal escape char */
			goto reject;

		case LEJP_MP_STRING_ESC_U1:
		case LEJP_MP_STRING_ESC_U2:
		case LEJP_MP_STRING_ESC_U3:
		case LEJP_MP_STRING_ESC_U4:
			ctx->uni <<= 4;
			if (c >= '0' && c <= '9')
				ctx->uni |= c - '0';
			else
				if (c >= 'a' && c <= 'f')
					ctx->uni = c - 'a' + 10;
				else
					if (c >= 'A' && c <= 'F')
						ctx->uni = c - 'A' + 10;
					else {
						ret = LEJP_REJECT_ILLEGAL_HEX;
						goto reject;
					}
			ctx->st[ctx->sp].s++;
			switch (s) {
			case LEJP_MP_STRING_ESC_U2:
				if (ctx->uni < 0x08)
					break;
				/*
				 * 0x08-0xff (0x0800 - 0xffff)
				 * emit 3-byte UTF-8
				 */
				c = 0xe0 | ((ctx->uni >> 4) & 0xf);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U3:
				if (ctx->uni >= 0x080) {
					/*
					 * 0x080 - 0xfff (0x0800 - 0xffff)
					 * middle 3-byte seq
					 * send ....XXXXXX..
					 */
					c = 0x80 | ((ctx->uni >> 2) & 0x3f);
					goto emit_string_char;
				}
				if (ctx->uni < 0x008)
					break;
				/*
				 * 0x008 - 0x7f (0x0080 - 0x07ff)
				 * start 2-byte seq
				 */
				c = 0xc0 | (ctx->uni >> 2);
				goto emit_string_char;

			case LEJP_MP_STRING_ESC_U4:
				if (ctx->uni >= 0x0080)
					/* end of 2 or 3-byte seq */
					c = 0x80 | (ctx->uni & 0x3f);
				else
					/* literal */
					c = (unsigned char)ctx->uni;

				ctx->st[ctx->sp].s = LEJP_MP_STRING;
				goto emit_string_char;
			default:
				break;
			}
			break;

		case LEJP_MP_DELIM:
			if (c != ':') {
				ret = LEJP_REJECT_MP_DELIM_MISSING_COLON;
				goto reject;
			}
			ctx->st[ctx->sp].s = LEJP_MP_VALUE;
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';

			lejp_check_path_match(ctx);
			if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_PAIR_NAME)) {
				ret = LEJP_REJECT_CALLBACK;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE:
			if (c >= '0' && c <= '9') {
				ctx->npos = 0;
				ctx->dcount = 0;
				ctx->f = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
				goto redo_character;
			}
			switch (c) {
			case'\"':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MP_STRING;
				ctx->npos = 0;
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				goto add_stack_level;

			case '{':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
				c = LEJP_MEMBERS;
				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->path_match = 0;
				goto add_stack_level;

			case '[':
				/* push */
				ctx->st[ctx->sp].s = LEJP_MP_ARRAY_END;
				c = LEJP_MP_VALUE;
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '[';
				ctx->path[ctx->pst[ctx->pst_sp].ppos++] = ']';
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_START)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->i[ctx->ipos++] = 0;
				if (ctx->ipos > LWS_ARRAY_SIZE(ctx->i)) {
					ret = LEJP_REJECT_MP_DELIM_ISTACK;
					goto reject;
				}
				goto add_stack_level;

			case ']':
				/* pop */
				if (!ctx->sp) { /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;
				goto array_end;

			case 't': /* true */
				ctx->uni = 0;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'f':
				ctx->uni = 4;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;

			case 'n':
				ctx->uni = 4 + 5;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_TOK;
				break;
			default:
				ret = LEJP_REJECT_MP_DELIM_BAD_VALUE_START;
				goto reject;
			}
			break;

		case LEJP_MP_VALUE_NUM_INT:
			if (!ctx->npos && c == '-') {
				ctx->f |= LEJP_SEEN_MINUS;
				goto append_npos;
			}

			if (ctx->dcount < 20 && c >= '0' && c <= '9') {
				if (ctx->f & LEJP_SEEN_POINT)
					ctx->f |= LEJP_SEEN_POST_POINT;
				ctx->dcount++;
				goto append_npos;
			}
			if (c == '.') {
				if (!ctx->dcount || (ctx->f & LEJP_SEEN_POINT)) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_POINT;
				goto append_npos;
			}
			/*
			 * before exponent, if we had . we must have had at
			 * least one more digit
			 */
			if ((ctx->f &
				(LEJP_SEEN_POINT | LEJP_SEEN_POST_POINT)) ==
							      LEJP_SEEN_POINT) {
				ret = LEJP_REJECT_MP_VAL_NUM_INT_NO_FRAC;
				goto reject;
			}
			if (c == 'e' || c == 'E') {
				if (ctx->f & LEJP_SEEN_EXP) {
					ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
					goto reject;
				}
				ctx->f |= LEJP_SEEN_EXP;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_EXP;
				goto append_npos;
			}
			/* if none of the above, did we even have a number? */
			if (!ctx->dcount) {
				ret = LEJP_REJECT_MP_VAL_NUM_FORMAT;
				goto reject;
			}

			ctx->buf[ctx->npos] = '\0';
			if (ctx->f & LEJP_SEEN_POINT) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_FLOAT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			} else {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NUM_INT)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
			}

			/* then this is the post-number character, loop */
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			goto redo_character;

		case LEJP_MP_VALUE_NUM_EXP:
			ctx->st[ctx->sp].s = LEJP_MP_VALUE_NUM_INT;
			if (c >= '0' && c <= '9')
				goto redo_character;
			if (c == '+' || c == '-')
				goto append_npos;
			ret = LEJP_REJECT_MP_VAL_NUM_EXP_BAD_EXP;
			goto reject;

		case LEJP_MP_VALUE_TOK: /* true, false, null */
			if (c != tokens[ctx->uni]) {
				ret = LEJP_REJECT_MP_VAL_TOK_UNKNOWN;
				goto reject;
			}
			ctx->uni++;
			if (tokens[ctx->uni] != ' ')
				break;
			switch (ctx->uni) {
			case 3:
				ctx->buf[0] = '1';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_TRUE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 8:
				ctx->buf[0] = '0';
				ctx->buf[1] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_FALSE)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			case 12:
				ctx->buf[0] = '\0';
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_NULL)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}
			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			break;

		case LEJP_MP_COMMA_OR_END:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				ctx->st[ctx->sp].s = LEJP_M_P;
				if (!ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = 0;
					/*
					 * since we came back to root level,
					 * no path can still match
					 */
					ctx->path_match = 0;
					break;
				}
				ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				if (ctx->st[ctx->sp - 1].s != LEJP_MP_ARRAY_END)
					break;
				/* top level is definitely an array... */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				break;
			}
			if (c == ']') {
				if (!ctx->sp) {  /* JSON can't end on ] */
					ret = LEJP_REJECT_MP_C_OR_E_UNDERF;
					goto reject;
				}
				/* pop */
				ctx->sp--;
				if (ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END) {
					ret = LEJP_REJECT_MP_C_OR_E_NOTARRAY;
					goto reject;
				}
				/* drop the path [n] bit */
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
					ctx->ipos = ctx->st[ctx->sp - 1].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
						ctx->pst[ctx->pst_sp].ppos <= ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				/* do LEJP_MP_ARRAY_END processing */
				goto redo_character;
			}
			if (c == '}') {
				if (!ctx->sp) {
					lejp_check_path_match(ctx);
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_OBJECT_END)) {
						ret = LEJP_REJECT_CALLBACK;
						goto reject;
					}
					if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_COMPLETE))
						goto reject;
					else
						/* done, return unused amount */
						return len;
				}

				/* pop */

				ctx->sp--;
				if (ctx->sp) {
					ctx->pst[ctx->pst_sp].ppos =
							ctx->st[ctx->sp].p;
					ctx->ipos = ctx->st[ctx->sp].i;
				}
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				if (ctx->path_match &&
				    ctx->pst[ctx->pst_sp].ppos <=
						    ctx->path_match_len)
					/*
					 * we shrank the path to be
					 * smaller than the matching point
					 */
					ctx->path_match = 0;

				lejp_check_path_match(ctx);
				if (ctx->pst[ctx->pst_sp].callback(ctx,
							LEJPCB_OBJECT_END)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				break;
			}

			ret = LEJP_REJECT_MP_C_OR_E_NEITHER;
			goto reject;

		case LEJP_MP_ARRAY_END:
array_end:
			ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
			if (c == ',') {
				/* increment this stack level's index */
				if (ctx->ipos)
					ctx->i[ctx->ipos - 1]++;
				ctx->st[ctx->sp].s = LEJP_MP_VALUE;
				if (ctx->sp)
					ctx->pst[ctx->pst_sp].ppos = ctx->st[ctx->sp - 1].p;
				ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
				break;
			}
			if (c != ']') {
				ret = LEJP_REJECT_MP_ARRAY_END_MISSING;
				goto reject;
			}

			ctx->st[ctx->sp].s = LEJP_MP_COMMA_OR_END;
			ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_ARRAY_END);
			break;
		}

		continue;

emit_string_char:
		if (!ctx->sp || ctx->st[ctx->sp - 1].s != LEJP_MP_DELIM) {
			/* assemble the string value into chunks */
			ctx->buf[ctx->npos++] = c;
			if (ctx->npos == sizeof(ctx->buf) - 1) {
				if (ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_VAL_STR_CHUNK)) {
					ret = LEJP_REJECT_CALLBACK;
					goto reject;
				}
				ctx->npos = 0;
			}
			continue;
		}
		/* name part of name:value pair */
		ctx->path[ctx->pst[ctx->pst_sp].ppos++] = c;
		continue;

add_stack_level:
		/* push on to the object stack */
		if (ctx->pst[ctx->pst_sp].ppos &&
		    ctx->st[ctx->sp].s != LEJP_MP_COMMA_OR_END &&
		    ctx->st[ctx->sp].s != LEJP_MP_ARRAY_END)
			ctx->path[ctx->pst[ctx->pst_sp].ppos++] = '.';

		ctx->st[ctx->sp].p = ctx->pst[ctx->pst_sp].ppos;
		ctx->st[ctx->sp].i = ctx->ipos;
		if (++ctx->sp == LWS_ARRAY_SIZE(ctx->st)) {
			ret = LEJP_REJECT_STACK_OVERFLOW;
			goto reject;
		}
		ctx->path[ctx->pst[ctx->pst_sp].ppos] = '\0';
		ctx->st[ctx->sp].s = c;
		ctx->st[ctx->sp].b = 0;
		continue;

append_npos:
		if (ctx->npos >= sizeof(ctx->buf)) {
			ret = LEJP_REJECT_NUM_TOO_LONG;
			goto reject;
		}
		ctx->buf[ctx->npos++] = c;
		continue;

redo_character:
		json--;
		len++;
	}

	return LEJP_CONTINUE;

reject:
	ctx->pst[ctx->pst_sp].callback(ctx, LEJPCB_FAILED);
	return ret;
}